

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdbmp.c
# Opt level: O2

void start_input_bmp(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  int *piVar1;
  jpeg_error_mgr *pjVar2;
  _func_JDIMENSION_j_compress_ptr_cjpeg_source_ptr *p_Var3;
  undefined8 *puVar4;
  bool bVar5;
  int iVar6;
  J_COLOR_SPACE JVar7;
  JDIMENSION JVar8;
  cd_progress_ptr progress;
  size_t sVar9;
  JSAMPARRAY ppJVar10;
  jvirt_sarray_ptr pjVar11;
  _func_void_j_compress_ptr_cjpeg_source_ptr *p_Var12;
  code *pcVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  short local_92;
  U_CHAR bmpinfoheader [64];
  U_CHAR bmpfileheader [14];
  
  sVar9 = fread(bmpfileheader,1,0xe,(FILE *)sinfo->input_file);
  if (sVar9 != 0xe) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x2b;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  if (bmpfileheader._0_2_ != 0x4d42) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x3f0;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  sVar9 = fread(bmpinfoheader,1,4,(FILE *)sinfo->input_file);
  if (sVar9 != 4) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x2b;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  if ((bmpinfoheader._0_4_ - 0x41 < 0xffffffcb) ||
     ((int)bmpfileheader._10_4_ < bmpinfoheader._0_4_ + 0xe)) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x3eb;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  sVar9 = fread(bmpinfoheader + 4,1,(long)(bmpinfoheader._0_4_ + -4),(FILE *)sinfo->input_file);
  if (sVar9 != (long)(bmpinfoheader._0_4_ + -4)) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x2b;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  if ((bmpinfoheader._0_4_ == 0x40) || (bmpinfoheader._0_4_ == 0x28)) {
    *(uint *)&sinfo[1].buffer = (uint)(ushort)bmpinfoheader._14_2_;
    local_92._0_1_ = bmpinfoheader[0xc];
    local_92._1_1_ = bmpinfoheader[0xd];
    if (((ushort)bmpinfoheader._14_2_ == 0x20) || (bmpinfoheader._14_2_ == 0x18)) {
      pjVar2 = cinfo->err;
      (pjVar2->msg_parm).i[0] = bmpinfoheader._4_4_;
      (pjVar2->msg_parm).i[1] = bmpinfoheader._8_4_;
      (pjVar2->msg_parm).i[2] = *(int *)&sinfo[1].buffer;
      pjVar2->msg_code = 0x3f2;
      (*pjVar2->emit_message)((j_common_ptr)cinfo,1);
LAB_00114c0b:
      iVar15 = 0;
    }
    else {
      if (bmpinfoheader._14_2_ != 8) {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 0x3ea;
        (*pjVar2->error_exit)((j_common_ptr)cinfo);
        goto LAB_00114c0b;
      }
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x3f3;
      (pjVar2->msg_parm).i[0] = bmpinfoheader._4_4_;
      (cinfo->err->msg_parm).i[1] = bmpinfoheader._8_4_;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      iVar15 = 4;
    }
    if (bmpinfoheader._16_4_ != 0) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x3ee;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    uVar14 = bmpinfoheader._32_4_;
    uVar18 = bmpinfoheader._8_4_;
    uVar17 = bmpinfoheader._4_4_;
    if ((0 < (int)bmpinfoheader._24_4_) && (0 < (int)bmpinfoheader._28_4_)) {
      cinfo->X_density = (UINT16)((ulong)(uint)bmpinfoheader._24_4_ / 100);
      cinfo->Y_density = (UINT16)((ulong)(uint)bmpinfoheader._28_4_ / 100);
      cinfo->density_unit = '\x02';
    }
  }
  else {
    if (bmpinfoheader._0_4_ != 0xc) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x3eb;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
      return;
    }
    uVar18 = (uint)bmpinfoheader._4_4_ >> 0x10;
    *(uint *)&sinfo[1].buffer = (uint)(ushort)bmpinfoheader._10_2_;
    local_92._0_1_ = bmpinfoheader[8];
    local_92._1_1_ = bmpinfoheader[9];
    uVar17 = bmpinfoheader._4_4_ & 0xffff;
    if (((ushort)bmpinfoheader._10_2_ == 0x20) || (bmpinfoheader._10_2_ == 0x18)) {
      pjVar2 = cinfo->err;
      (pjVar2->msg_parm).i[0] = bmpinfoheader._4_4_ & 0xffff;
      (pjVar2->msg_parm).i[1] = uVar18;
      (pjVar2->msg_parm).i[2] = *(int *)&sinfo[1].buffer;
      pjVar2->msg_code = 0x3f4;
      (*pjVar2->emit_message)((j_common_ptr)cinfo,1);
    }
    else {
      if (bmpinfoheader._10_2_ == 8) {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 0x3f5;
        (pjVar2->msg_parm).i[0] = bmpinfoheader._4_4_ & 0xffff;
        (cinfo->err->msg_parm).i[1] = uVar18;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
        iVar15 = 3;
        uVar14 = 0;
        goto LAB_00114c80;
      }
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x3ea;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    iVar15 = 0;
    uVar14 = 0;
  }
LAB_00114c80:
  if (((int)uVar17 < 1) || ((int)uVar18 < 1)) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x3ef;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  if (local_92 != 1) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x3ec;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  iVar16 = bmpfileheader._10_4_ - (bmpinfoheader._0_4_ + 0xe);
  if (iVar15 != 0) {
    if ((int)uVar14 < 1) {
      uVar14 = 0x100;
    }
    else if (0x100 < uVar14) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x3e9;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    bVar5 = true;
    ppJVar10 = (*cinfo->mem->alloc_sarray)((j_common_ptr)cinfo,1,uVar14,3);
    sinfo[1].get_pixel_rows = (_func_JDIMENSION_j_compress_ptr_cjpeg_source_ptr *)ppJVar10;
    *(uint *)((long)&sinfo[1].buffer + 4) = uVar14;
    if (iVar15 == 3) {
      bVar5 = true;
      for (uVar19 = 0; uVar14 != uVar19; uVar19 = uVar19 + 1) {
        iVar6 = read_byte((bmp_source_ptr)sinfo);
        *(char *)(*(long *)(sinfo[1].get_pixel_rows + 0x10) + uVar19) = (char)iVar6;
        iVar6 = read_byte((bmp_source_ptr)sinfo);
        *(char *)(*(long *)(sinfo[1].get_pixel_rows + 8) + uVar19) = (char)iVar6;
        iVar6 = read_byte((bmp_source_ptr)sinfo);
        *(char *)(*(long *)sinfo[1].get_pixel_rows + uVar19) = (char)iVar6;
        p_Var3 = sinfo[1].get_pixel_rows;
        if ((*(char *)(*(long *)(p_Var3 + 0x10) + uVar19) !=
             *(char *)(*(long *)(p_Var3 + 8) + uVar19)) ||
           (*(char *)(*(long *)(p_Var3 + 0x10) + uVar19) != *(char *)(*(long *)p_Var3 + uVar19))) {
          bVar5 = false;
        }
      }
    }
    else if (iVar15 == 4) {
      bVar5 = true;
      for (uVar19 = 0; uVar14 != uVar19; uVar19 = uVar19 + 1) {
        iVar6 = read_byte((bmp_source_ptr)sinfo);
        *(char *)(*(long *)(sinfo[1].get_pixel_rows + 0x10) + uVar19) = (char)iVar6;
        iVar6 = read_byte((bmp_source_ptr)sinfo);
        *(char *)(*(long *)(sinfo[1].get_pixel_rows + 8) + uVar19) = (char)iVar6;
        iVar6 = read_byte((bmp_source_ptr)sinfo);
        *(char *)(*(long *)sinfo[1].get_pixel_rows + uVar19) = (char)iVar6;
        read_byte((bmp_source_ptr)sinfo);
        p_Var3 = sinfo[1].get_pixel_rows;
        if ((*(char *)(*(long *)(p_Var3 + 0x10) + uVar19) !=
             *(char *)(*(long *)(p_Var3 + 8) + uVar19)) ||
           (*(char *)(*(long *)(p_Var3 + 0x10) + uVar19) != *(char *)(*(long *)p_Var3 + uVar19))) {
          bVar5 = false;
        }
      }
    }
    else {
      puVar4 = *(undefined8 **)sinfo[1].start_input;
      *(undefined4 *)(puVar4 + 5) = 0x3e9;
      (*(code *)*puVar4)();
    }
    p_Var12 = sinfo[1].start_input;
    if (bVar5 && *(int *)(p_Var12 + 0x3c) == 0) {
      *(undefined4 *)(p_Var12 + 0x3c) = 1;
    }
    else if (*(int *)(p_Var12 + 0x3c) == 1 && !bVar5) {
      puVar4 = *(undefined8 **)p_Var12;
      *(undefined4 *)(puVar4 + 5) = 9;
      (*(code *)*puVar4)();
    }
    iVar16 = iVar16 - uVar14 * iVar15;
  }
  if (iVar16 < 0) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x3eb;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  for (; 0 < iVar16; iVar16 = iVar16 + -1) {
    read_byte((bmp_source_ptr)sinfo);
  }
  iVar15 = *(int *)&sinfo[1].buffer;
  uVar19 = (ulong)(int)uVar17;
  if (iVar15 == 0x20) {
    JVar7 = cinfo->in_color_space;
    if (JVar7 == JCS_RGB) {
LAB_00114f6e:
      cinfo->input_components = rgb_pixelsize[JVar7];
    }
    else {
      if (JVar7 == JCS_UNKNOWN) {
        cinfo->in_color_space = JCS_EXT_BGRA;
        JVar7 = JCS_EXT_BGRA;
        goto LAB_00114f6e;
      }
      if (JVar7 - JCS_EXT_RGB < 10) goto LAB_00114f6e;
      if (JVar7 == JCS_CMYK) {
        cinfo->input_components = 4;
      }
      else {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 9;
        (*pjVar2->error_exit)((j_common_ptr)cinfo);
      }
    }
    if ((int)(uVar19 >> 0x1e) != 0) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x46;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    JVar8 = uVar17 * 4;
  }
  else if (iVar15 == 0x18) {
    JVar7 = cinfo->in_color_space;
    if (JVar7 == JCS_RGB) {
LAB_00114f34:
      cinfo->input_components = rgb_pixelsize[JVar7];
    }
    else {
      if (JVar7 == JCS_UNKNOWN) {
        cinfo->in_color_space = JCS_EXT_BGR;
        JVar7 = JCS_EXT_BGR;
        goto LAB_00114f34;
      }
      if (JVar7 - JCS_EXT_RGB < 10) goto LAB_00114f34;
      if (JVar7 == JCS_CMYK) {
        cinfo->input_components = 4;
      }
      else {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 9;
        (*pjVar2->error_exit)((j_common_ptr)cinfo);
      }
    }
    if (uVar19 * 3 >> 0x20 != 0) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x46;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    JVar8 = uVar17 * 3;
  }
  else if (iVar15 == 8) {
    JVar7 = cinfo->in_color_space;
    JVar8 = uVar17;
    if (JVar7 != JCS_RGB) {
      if (JVar7 == JCS_UNKNOWN) {
        cinfo->in_color_space = JCS_EXT_RGB;
        JVar7 = JCS_EXT_RGB;
      }
      else if (9 < JVar7 - JCS_EXT_RGB) {
        if (JVar7 == JCS_CMYK) {
          cinfo->input_components = 4;
        }
        else if (JVar7 == JCS_GRAYSCALE) {
          cinfo->input_components = 1;
        }
        else {
          pjVar2 = cinfo->err;
          pjVar2->msg_code = 9;
          (*pjVar2->error_exit)((j_common_ptr)cinfo);
        }
        goto LAB_00114fbf;
      }
    }
    cinfo->input_components = rgb_pixelsize[JVar7];
  }
  else {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x3ea;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
    JVar8 = 0;
  }
LAB_00114fbf:
  uVar14 = (-JVar8 & 3) + JVar8;
  *(uint *)((long)&sinfo[1].input_file + 4) = uVar14;
  if (sinfo[1].buffer_height == 0) {
    p_Var12 = (_func_void_j_compress_ptr_cjpeg_source_ptr *)
              (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(ulong)uVar14);
    sinfo[2].start_input = p_Var12;
    iVar15 = *(int *)&sinfo[1].buffer;
    if (iVar15 == 0x20) {
      pcVar13 = get_32bit_row;
    }
    else if (iVar15 == 0x18) {
      pcVar13 = get_24bit_row;
    }
    else {
      if (iVar15 != 8) {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 0x3ea;
        (*pjVar2->error_exit)((j_common_ptr)cinfo);
        goto LAB_00115054;
      }
      pcVar13 = get_8bit_row;
    }
    sinfo->get_pixel_rows = pcVar13;
  }
  else {
    pjVar11 = (*cinfo->mem->request_virt_sarray)((j_common_ptr)cinfo,1,0,uVar14,uVar18,1);
    sinfo[1].finish_input = (_func_void_j_compress_ptr_cjpeg_source_ptr *)pjVar11;
    sinfo->get_pixel_rows = preload_image;
    if (cinfo->progress != (jpeg_progress_mgr *)0x0) {
      piVar1 = (int *)((long)&cinfo->progress[1].progress_monitor + 4);
      *piVar1 = *piVar1 + 1;
    }
  }
LAB_00115054:
  iVar15 = cinfo->input_components;
  if (uVar19 * (long)iVar15 >> 0x20 != 0) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x46;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
    iVar15 = cinfo->input_components;
  }
  ppJVar10 = (*cinfo->mem->alloc_sarray)((j_common_ptr)cinfo,1,iVar15 * uVar17,1);
  sinfo->buffer = ppJVar10;
  sinfo->buffer_height = 1;
  cinfo->data_precision = 8;
  cinfo->image_width = uVar17;
  cinfo->image_height = uVar18;
  return;
}

Assistant:

METHODDEF(void)
start_input_bmp(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
{
  bmp_source_ptr source = (bmp_source_ptr)sinfo;
  U_CHAR bmpfileheader[14];
  U_CHAR bmpinfoheader[64];

#define GET_2B(array, offset) \
  ((unsigned short)UCH(array[offset]) + \
   (((unsigned short)UCH(array[offset + 1])) << 8))
#define GET_4B(array, offset) \
  ((unsigned int)UCH(array[offset]) + \
   (((unsigned int)UCH(array[offset + 1])) << 8) + \
   (((unsigned int)UCH(array[offset + 2])) << 16) + \
   (((unsigned int)UCH(array[offset + 3])) << 24))

  int bfOffBits;
  int headerSize;
  int biWidth;
  int biHeight;
  unsigned short biPlanes;
  unsigned int biCompression;
  int biXPelsPerMeter, biYPelsPerMeter;
  int biClrUsed = 0;
  int mapentrysize = 0;         /* 0 indicates no colormap */
  int bPad;
  JDIMENSION row_width = 0;

  /* Read and verify the bitmap file header */
  if (!ReadOK(source->pub.input_file, bmpfileheader, 14))
    ERREXIT(cinfo, JERR_INPUT_EOF);
  if (GET_2B(bmpfileheader, 0) != 0x4D42) /* 'BM' */
    ERREXIT(cinfo, JERR_BMP_NOT);
  bfOffBits = GET_4B(bmpfileheader, 10);
  /* We ignore the remaining fileheader fields */

  /* The infoheader might be 12 bytes (OS/2 1.x), 40 bytes (Windows),
   * or 64 bytes (OS/2 2.x).  Check the first 4 bytes to find out which.
   */
  if (!ReadOK(source->pub.input_file, bmpinfoheader, 4))
    ERREXIT(cinfo, JERR_INPUT_EOF);
  headerSize = GET_4B(bmpinfoheader, 0);
  if (headerSize < 12 || headerSize > 64 || (headerSize + 14) > bfOffBits)
    ERREXIT(cinfo, JERR_BMP_BADHEADER);
  if (!ReadOK(source->pub.input_file, bmpinfoheader + 4, headerSize - 4))
    ERREXIT(cinfo, JERR_INPUT_EOF);

  switch (headerSize) {
  case 12:
    /* Decode OS/2 1.x header (Microsoft calls this a BITMAPCOREHEADER) */
    biWidth = (int)GET_2B(bmpinfoheader, 4);
    biHeight = (int)GET_2B(bmpinfoheader, 6);
    biPlanes = GET_2B(bmpinfoheader, 8);
    source->bits_per_pixel = (int)GET_2B(bmpinfoheader, 10);

    switch (source->bits_per_pixel) {
    case 8:                     /* colormapped image */
      mapentrysize = 3;         /* OS/2 uses RGBTRIPLE colormap */
      TRACEMS2(cinfo, 1, JTRC_BMP_OS2_MAPPED, biWidth, biHeight);
      break;
    case 24:                    /* RGB image */
    case 32:                    /* RGB image + Alpha channel */
      TRACEMS3(cinfo, 1, JTRC_BMP_OS2, biWidth, biHeight,
               source->bits_per_pixel);
      break;
    default:
      ERREXIT(cinfo, JERR_BMP_BADDEPTH);
      break;
    }
    break;
  case 40:
  case 64:
    /* Decode Windows 3.x header (Microsoft calls this a BITMAPINFOHEADER) */
    /* or OS/2 2.x header, which has additional fields that we ignore */
    biWidth = (int)GET_4B(bmpinfoheader, 4);
    biHeight = (int)GET_4B(bmpinfoheader, 8);
    biPlanes = GET_2B(bmpinfoheader, 12);
    source->bits_per_pixel = (int)GET_2B(bmpinfoheader, 14);
    biCompression = GET_4B(bmpinfoheader, 16);
    biXPelsPerMeter = (int)GET_4B(bmpinfoheader, 24);
    biYPelsPerMeter = (int)GET_4B(bmpinfoheader, 28);
    biClrUsed = GET_4B(bmpinfoheader, 32);
    /* biSizeImage, biClrImportant fields are ignored */

    switch (source->bits_per_pixel) {
    case 8:                     /* colormapped image */
      mapentrysize = 4;         /* Windows uses RGBQUAD colormap */
      TRACEMS2(cinfo, 1, JTRC_BMP_MAPPED, biWidth, biHeight);
      break;
    case 24:                    /* RGB image */
    case 32:                    /* RGB image + Alpha channel */
      TRACEMS3(cinfo, 1, JTRC_BMP, biWidth, biHeight, source->bits_per_pixel);
      break;
    default:
      ERREXIT(cinfo, JERR_BMP_BADDEPTH);
      break;
    }
    if (biCompression != 0)
      ERREXIT(cinfo, JERR_BMP_COMPRESSED);

    if (biXPelsPerMeter > 0 && biYPelsPerMeter > 0) {
      /* Set JFIF density parameters from the BMP data */
      cinfo->X_density = (UINT16)(biXPelsPerMeter / 100); /* 100 cm per meter */
      cinfo->Y_density = (UINT16)(biYPelsPerMeter / 100);
      cinfo->density_unit = 2;  /* dots/cm */
    }
    break;
  default:
    ERREXIT(cinfo, JERR_BMP_BADHEADER);
    return;
  }

  if (biWidth <= 0 || biHeight <= 0)
    ERREXIT(cinfo, JERR_BMP_EMPTY);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  if (sinfo->max_pixels &&
      (unsigned long long)biWidth * biHeight > sinfo->max_pixels)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
#endif
  if (biPlanes != 1)
    ERREXIT(cinfo, JERR_BMP_BADPLANES);

  /* Compute distance to bitmap data --- will adjust for colormap below */
  bPad = bfOffBits - (headerSize + 14);

  /* Read the colormap, if any */
  if (mapentrysize > 0) {
    if (biClrUsed <= 0)
      biClrUsed = 256;          /* assume it's 256 */
    else if (biClrUsed > 256)
      ERREXIT(cinfo, JERR_BMP_BADCMAP);
    /* Allocate space to store the colormap */
    source->colormap = (*cinfo->mem->alloc_sarray)
      ((j_common_ptr)cinfo, JPOOL_IMAGE, (JDIMENSION)biClrUsed, (JDIMENSION)3);
    source->cmap_length = (int)biClrUsed;
    /* and read it from the file */
    read_colormap(source, (int)biClrUsed, mapentrysize);
    /* account for size of colormap */
    bPad -= biClrUsed * mapentrysize;
  }

  /* Skip any remaining pad bytes */
  if (bPad < 0)                 /* incorrect bfOffBits value? */
    ERREXIT(cinfo, JERR_BMP_BADHEADER);
  while (--bPad >= 0) {
    (void)read_byte(source);
  }

  /* Compute row width in file, including padding to 4-byte boundary */
  switch (source->bits_per_pixel) {
  case 8:
    if (cinfo->in_color_space == JCS_UNKNOWN)
      cinfo->in_color_space = JCS_EXT_RGB;
    if (IsExtRGB(cinfo->in_color_space))
      cinfo->input_components = rgb_pixelsize[cinfo->in_color_space];
    else if (cinfo->in_color_space == JCS_GRAYSCALE)
      cinfo->input_components = 1;
    else if (cinfo->in_color_space == JCS_CMYK)
      cinfo->input_components = 4;
    else
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    row_width = (JDIMENSION)biWidth;
    break;
  case 24:
    if (cinfo->in_color_space == JCS_UNKNOWN)
      cinfo->in_color_space = JCS_EXT_BGR;
    if (IsExtRGB(cinfo->in_color_space))
      cinfo->input_components = rgb_pixelsize[cinfo->in_color_space];
    else if (cinfo->in_color_space == JCS_CMYK)
      cinfo->input_components = 4;
    else
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    if ((unsigned long long)biWidth * 3ULL > 0xFFFFFFFFULL)
      ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
    row_width = (JDIMENSION)biWidth * 3;
    break;
  case 32:
    if (cinfo->in_color_space == JCS_UNKNOWN)
      cinfo->in_color_space = JCS_EXT_BGRA;
    if (IsExtRGB(cinfo->in_color_space))
      cinfo->input_components = rgb_pixelsize[cinfo->in_color_space];
    else if (cinfo->in_color_space == JCS_CMYK)
      cinfo->input_components = 4;
    else
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    if ((unsigned long long)biWidth * 4ULL > 0xFFFFFFFFULL)
      ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
    row_width = (JDIMENSION)biWidth * 4;
    break;
  default:
    ERREXIT(cinfo, JERR_BMP_BADDEPTH);
  }
  while ((row_width & 3) != 0) row_width++;
  source->row_width = row_width;

  if (source->use_inversion_array) {
    /* Allocate space for inversion array, prepare for preload pass */
    source->whole_image = (*cinfo->mem->request_virt_sarray)
      ((j_common_ptr)cinfo, JPOOL_IMAGE, FALSE,
       row_width, (JDIMENSION)biHeight, (JDIMENSION)1);
    source->pub.get_pixel_rows = preload_image;
    if (cinfo->progress != NULL) {
      cd_progress_ptr progress = (cd_progress_ptr)cinfo->progress;
      progress->total_extra_passes++; /* count file input as separate pass */
    }
  } else {
    source->iobuffer = (U_CHAR *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE, row_width);
    switch (source->bits_per_pixel) {
    case 8:
      source->pub.get_pixel_rows = get_8bit_row;
      break;
    case 24:
      source->pub.get_pixel_rows = get_24bit_row;
      break;
    case 32:
      source->pub.get_pixel_rows = get_32bit_row;
      break;
    default:
      ERREXIT(cinfo, JERR_BMP_BADDEPTH);
    }
  }

  /* Ensure that biWidth * cinfo->input_components doesn't exceed the maximum
     value of the JDIMENSION type.  This is only a danger with BMP files, since
     their width and height fields are 32-bit integers. */
  if ((unsigned long long)biWidth *
      (unsigned long long)cinfo->input_components > 0xFFFFFFFFULL)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
  /* Allocate one-row buffer for returned data */
  source->pub.buffer = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr)cinfo, JPOOL_IMAGE,
     (JDIMENSION)biWidth * (JDIMENSION)cinfo->input_components, (JDIMENSION)1);
  source->pub.buffer_height = 1;

  cinfo->data_precision = 8;
  cinfo->image_width = (JDIMENSION)biWidth;
  cinfo->image_height = (JDIMENSION)biHeight;
}